

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.cpp
# Opt level: O2

string_view libtorrent::aux::integer_to_str(array<char,_21UL> *buf,integer_type val)

{
  ushort uVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  integer_type iVar5;
  ulong uVar6;
  string_view sVar7;
  size_t sStack_8;
  
  if (-1 < val) {
    if ((ulong)val < 10) {
      buf->_M_elems[0] = (byte)val | 0x30;
      sStack_8 = 1;
      goto LAB_001a5f6a;
    }
    uVar1 = (ushort)val;
    if ((ulong)val < 100) {
      buf->_M_elems[0] = (byte)((uVar1 & 0xff) / 10) | 0x30;
      buf->_M_elems[1] = (byte)((uVar1 & 0xff) % 10) | 0x30;
      sStack_8 = 2;
      goto LAB_001a5f6a;
    }
    if ((ulong)val < 1000) {
      buf->_M_elems[0] = (byte)(uVar1 / 100) | 0x30;
      buf->_M_elems[1] = (byte)((uVar1 / 10 & 0xff) % 10) | 0x30;
      buf->_M_elems[2] = (byte)((uint)uVar1 % 10) | 0x30;
      sStack_8 = 3;
      goto LAB_001a5f6a;
    }
    if ((ulong)val < 10000) {
      buf->_M_elems[0] = (byte)(uVar1 / 1000) | 0x30;
      buf->_M_elems[1] = (byte)((uVar1 / 100 & 0xff) % 10) | 0x30;
      buf->_M_elems[2] = (byte)((uint)(uVar1 / 10) % 10) | 0x30;
      buf->_M_elems[3] = (byte)((uint)uVar1 % 10) | 0x30;
      sStack_8 = 4;
      goto LAB_001a5f6a;
    }
    if ((ulong)val < 100000) {
      buf->_M_elems[0] = (byte)((val & 0xffffffffU) / 10000) | 0x30;
      buf->_M_elems[1] = (byte)(((ushort)((val & 0xffffffffU) / 1000) & 0xff) % 10) | 0x30;
      buf->_M_elems[2] = (byte)((uint)(ushort)((val & 0xffffffffU) / 100) % 10) | 0x30;
      buf->_M_elems[3] = (byte)((uint)(ushort)((val & 0xffffffffU) / 10) % 10) | 0x30;
      buf->_M_elems[4] = (byte)((val & 0xffffffffU) % 10) | 0x30;
      sStack_8 = 5;
      goto LAB_001a5f6a;
    }
  }
  iVar5 = -val;
  if (val < 1) {
    iVar5 = val;
  }
  lVar3 = 1;
  pcVar2 = buf[1]._M_elems + 1;
  do {
    pcVar4 = pcVar2;
    pcVar4[-2] = '0' - (char)(iVar5 % 10);
    uVar6 = iVar5 + 9;
    lVar3 = lVar3 + -1;
    pcVar2 = pcVar4 + -1;
    iVar5 = iVar5 / 10;
  } while (0x12 < uVar6);
  if (val < 1) {
    pcVar4[-3] = 0x2d;
    sStack_8 = -2;
  }
  else {
    sStack_8 = -1;
  }
  buf = (array<char,_21UL> *)(pcVar4 + -1 + sStack_8);
  sStack_8 = -(lVar3 + sStack_8);
LAB_001a5f6a:
  sVar7._M_str = buf->_M_elems;
  sVar7._M_len = sStack_8;
  return sVar7;
}

Assistant:

string_view integer_to_str(std::array<char, 21>& buf, entry::integer_type val)
	{
		if (val >= 0)
		{
			if (val < 10)
			{
				buf[0] = '0' + static_cast<char>(val);
				return {buf.data(), std::size_t(1)};
			}
			if (val < 100)
			{
				buf[0] = '0' + (val / 10) % 10;
				buf[1] = '0' + val % 10;
				return {buf.data(), std::size_t(2)};
			}
			if (val < 1000)
			{
				buf[0] = '0' + (val / 100) % 10;
				buf[1] = '0' + (val / 10) % 10;
				buf[2] = '0' + val % 10;
				return {buf.data(), std::size_t(3)};
			}
			if (val < 10000)
			{
				buf[0] = '0' + (val / 1000) % 10;
				buf[1] = '0' + (val / 100) % 10;
				buf[2] = '0' + (val / 10) % 10;
				buf[3] = '0' + val % 10;
				return {buf.data(), std::size_t(4)};
			}
			if (val < 100000)
			{
				buf[0] = '0' + (val / 10000) % 10;
				buf[1] = '0' + (val / 1000) % 10;
				buf[2] = '0' + (val / 100) % 10;
				buf[3] = '0' + (val / 10) % 10;
				buf[4] = '0' + val % 10;
				return {buf.data(), std::size_t(5)};
			}
		}
		// val == 0 is handled in the fast-path above
		TORRENT_ASSERT(val != 0);
		// slow path
		// convert positive values to negative, since the negative space is
		// larger, so we can fit INT64_MIN
		int sign = 1;
		if (val > 0)
		{
			sign = 0;
			val = -val;
		}
		char* ptr = &buf.back();
		do
		{
			*ptr-- = '0' - char(val % 10);
			val /= 10;
		} while (val != 0);
		if (sign) *ptr-- = '-';
		++ptr;
		return {ptr, static_cast<std::size_t>(&buf.back() - ptr + 1)};
	}